

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFNameTreeObjectHelper.cc
# Opt level: O0

string * __thiscall
(anonymous_namespace)::NameTreeDetails::itemsKey_abi_cxx11_(NameTreeDetails *this)

{
  int iVar1;
  allocator<char> local_11;
  NameTreeDetails *local_10;
  NameTreeDetails *this_local;
  
  if (itemsKey[abi:cxx11]()::k_abi_cxx11_ == '\0') {
    local_10 = this;
    iVar1 = __cxa_guard_acquire(&itemsKey[abi:cxx11]()::k_abi_cxx11_);
    if (iVar1 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&itemsKey[abi:cxx11]()::k_abi_cxx11_,"/Names",&local_11);
      std::allocator<char>::~allocator(&local_11);
      __cxa_atexit(std::__cxx11::string::~string,&itemsKey[abi:cxx11]()::k_abi_cxx11_,&__dso_handle)
      ;
      __cxa_guard_release(&itemsKey[abi:cxx11]()::k_abi_cxx11_);
    }
  }
  return &itemsKey[abi:cxx11]()::k_abi_cxx11_;
}

Assistant:

std::string const&
        itemsKey() const override
        {
            static std::string k("/Names");
            return k;
        }